

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

char * cmGetProjectName(void *arg)

{
  int iVar1;
  cmStateSnapshot cStack_48;
  string local_30;
  
  if (cmGetProjectName::name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&cmGetProjectName::name_abi_cxx11_);
    if (iVar1 != 0) {
      cmGetProjectName::name_abi_cxx11_._M_dataplus._M_p =
           (pointer)&cmGetProjectName::name_abi_cxx11_.field_2;
      cmGetProjectName::name_abi_cxx11_._M_string_length = 0;
      cmGetProjectName::name_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&cmGetProjectName::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cmGetProjectName::name_abi_cxx11_);
    }
  }
  cmMakefile::GetStateSnapshot((cmMakefile *)arg);
  cmStateSnapshot::GetProjectName_abi_cxx11_(&local_30,&cStack_48);
  std::__cxx11::string::operator=((string *)&cmGetProjectName::name_abi_cxx11_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return cmGetProjectName::name_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* CCONV cmGetProjectName(void* arg)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  static std::string name;
  name = mf->GetStateSnapshot().GetProjectName();
  return name.c_str();
}